

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswCut.c
# Opt level: O2

int Csw_CutMergeOrdered(Csw_Man_t *p,Csw_Cut_t *pC0,Csw_Cut_t *pC1,Csw_Cut_t *pC)

{
  long lVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  
  bVar2 = pC0->nFanins;
  uVar9 = (ulong)bVar2;
  cVar3 = pC1->nFanins;
  uVar12 = (uint)cVar3;
  if ((char)bVar2 < cVar3) {
    __assert_fail("pC0->nFanins >= pC1->nFanins",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                  ,0x129,
                  "int Csw_CutMergeOrdered(Csw_Man_t *, Csw_Cut_t *, Csw_Cut_t *, Csw_Cut_t *)");
  }
  uVar10 = (uint)(char)bVar2;
  uVar6 = p->nLeafMax;
  if (uVar6 == uVar12 && uVar6 == uVar10) {
    uVar11 = (ulong)uVar10;
    uVar7 = 0;
    if ((char)bVar2 < '\x01') {
      uVar11 = 0;
    }
    do {
      if (uVar11 == uVar7) {
        for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
          *(undefined4 *)((long)&pC[1].pNext + uVar7 * 4) =
               *(undefined4 *)((long)&pC0[1].pNext + uVar7 * 4);
        }
        goto LAB_0041df77;
      }
      lVar15 = uVar7 * 4;
      lVar1 = uVar7 * 4;
      uVar7 = uVar7 + 1;
    } while (*(int *)((long)&pC0[1].pNext + lVar15) == *(int *)((long)&pC1[1].pNext + lVar1));
LAB_0041de96:
    iVar5 = 0;
  }
  else {
    if (uVar6 == uVar10) {
      uVar11 = 0;
      uVar7 = (ulong)uVar12;
      if (cVar3 < '\x01') {
        uVar7 = uVar11;
      }
      for (; uVar14 = (ulong)uVar10, uVar11 != uVar7; uVar11 = uVar11 + 1) {
        do {
          if ((int)uVar14 < 1) {
            if (uVar14 == 0) goto LAB_0041de96;
            break;
          }
          lVar15 = uVar14 * 2;
          uVar14 = uVar14 - 1;
        } while (*(int *)(&pC0->nCutSize + lVar15) != *(int *)((long)&pC1[1].pNext + uVar11 * 4));
      }
      uVar11 = 0;
      uVar7 = (ulong)uVar10;
      if ((char)bVar2 < '\x01') {
        uVar7 = uVar11;
      }
      for (; uVar7 != uVar11; uVar11 = uVar11 + 1) {
        *(undefined4 *)((long)&pC[1].pNext + uVar11 * 4) =
             *(undefined4 *)((long)&pC0[1].pNext + uVar11 * 4);
      }
    }
    else {
      uVar13 = 0;
      uVar8 = 0;
      for (uVar9 = 0; (long)uVar9 < (long)(int)uVar6; uVar9 = uVar9 + 1) {
        if (uVar8 == uVar12) {
          if (uVar13 == uVar10) goto LAB_0041df77;
          *(undefined4 *)((long)&pC[1].pNext + uVar9 * 4) =
               *(undefined4 *)((long)&pC0[1].pNext + (long)(int)uVar13 * 4);
          uVar13 = uVar13 + 1;
          uVar8 = uVar12;
        }
        else {
          lVar15 = (long)(int)uVar8;
          if (uVar13 == uVar10) {
            uVar8 = uVar8 + 1;
            *(undefined4 *)((long)&pC[1].pNext + uVar9 * 4) =
                 *(undefined4 *)((long)&pC1[1].pNext + lVar15 * 4);
            uVar13 = uVar10;
          }
          else {
            iVar5 = *(int *)((long)&pC0[1].pNext + (long)(int)uVar13 * 4);
            iVar4 = *(int *)((long)&pC1[1].pNext + lVar15 * 4);
            if (iVar5 < iVar4) {
              uVar13 = uVar13 + 1;
              *(int *)((long)&pC[1].pNext + uVar9 * 4) = iVar5;
            }
            else if (iVar4 < iVar5) {
              uVar8 = uVar8 + 1;
              *(int *)((long)&pC[1].pNext + uVar9 * 4) = iVar4;
            }
            else {
              uVar13 = uVar13 + 1;
              *(int *)((long)&pC[1].pNext + uVar9 * 4) = iVar5;
              uVar8 = uVar8 + 1;
            }
          }
        }
        uVar6 = p->nLeafMax;
      }
      if ((int)uVar13 < (int)uVar10) {
        return 0;
      }
      if ((int)uVar8 < (int)uVar12) {
        return 0;
      }
    }
LAB_0041df77:
    pC->nFanins = (char)uVar9;
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

static inline int Csw_CutMergeOrdered( Csw_Man_t * p, Csw_Cut_t * pC0, Csw_Cut_t * pC1, Csw_Cut_t * pC )
{ 
    int i, k, c;
    assert( pC0->nFanins >= pC1->nFanins );
    // the case of the largest cut sizes
    if ( pC0->nFanins == p->nLeafMax && pC1->nFanins == p->nLeafMax )
    {
        for ( i = 0; i < pC0->nFanins; i++ )
            if ( pC0->pFanins[i] != pC1->pFanins[i] )
                return 0;
        for ( i = 0; i < pC0->nFanins; i++ )
            pC->pFanins[i] = pC0->pFanins[i];
        pC->nFanins = pC0->nFanins;
        return 1;
    }
    // the case when one of the cuts is the largest
    if ( pC0->nFanins == p->nLeafMax )
    {
        for ( i = 0; i < pC1->nFanins; i++ )
        {
            for ( k = pC0->nFanins - 1; k >= 0; k-- )
                if ( pC0->pFanins[k] == pC1->pFanins[i] )
                    break;
            if ( k == -1 ) // did not find
                return 0;
        }
        for ( i = 0; i < pC0->nFanins; i++ )
            pC->pFanins[i] = pC0->pFanins[i];
        pC->nFanins = pC0->nFanins;
        return 1;
    }

    // compare two cuts with different numbers
    i = k = 0;
    for ( c = 0; c < p->nLeafMax; c++ )
    {
        if ( k == pC1->nFanins )
        {
            if ( i == pC0->nFanins )
            {
                pC->nFanins = c;
                return 1;
            }
            pC->pFanins[c] = pC0->pFanins[i++];
            continue;
        }
        if ( i == pC0->nFanins )
        {
            if ( k == pC1->nFanins )
            {
                pC->nFanins = c;
                return 1;
            }
            pC->pFanins[c] = pC1->pFanins[k++];
            continue;
        }
        if ( pC0->pFanins[i] < pC1->pFanins[k] )
        {
            pC->pFanins[c] = pC0->pFanins[i++];
            continue;
        }
        if ( pC0->pFanins[i] > pC1->pFanins[k] )
        {
            pC->pFanins[c] = pC1->pFanins[k++];
            continue;
        }
        pC->pFanins[c] = pC0->pFanins[i++]; 
        k++;
    }
    if ( i < pC0->nFanins || k < pC1->nFanins )
        return 0;
    pC->nFanins = c;
    return 1;
}